

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O3

void loguru::add_stack_cleanup(char *find_this,char *replace_with_this)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  char *in_RSI;
  char *in_RDI;
  double __x;
  char *local_60;
  char *local_58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  
  sVar1 = strlen(in_RDI);
  sVar2 = strlen(in_RSI);
  if (sVar2 < sVar1) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_*&,_const_char_*&,_true>(&local_50,&local_58,&local_60);
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)s_user_stack_cleanups_abi_cxx11_,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.second._M_dataplus._M_p != &local_50.second.field_2) {
      operator_delete(local_50.second._M_dataplus._M_p,
                      local_50.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.first._M_dataplus._M_p != &local_50.first.field_2) {
      operator_delete(local_50.first._M_dataplus._M_p,
                      local_50.first.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    iVar3 = s_max_out_verbosity;
    if (s_max_out_verbosity < g_stderr_verbosity) {
      iVar3 = g_stderr_verbosity;
    }
    if (-2 < iVar3) {
      log(__x);
      return;
    }
  }
  return;
}

Assistant:

void add_stack_cleanup(const char* find_this, const char* replace_with_this)
	{
		if (strlen(find_this) <= strlen(replace_with_this)) {
			LOG_F(WARNING, "add_stack_cleanup: the replacement should be shorter than the pattern!");
			return;
		}

		s_user_stack_cleanups.push_back(StringPair(find_this, replace_with_this));
	}